

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Marshal.c
# Opt level: O2

TPM_RC TPMU_HA_Unmarshal(TPMU_HA *target,BYTE **buffer,INT32 *size,UINT32 selector)

{
  BYTE *pBVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  TPM_RC TVar9;
  
  TVar9 = 0;
  switch(selector) {
  case 0xb:
    TVar9 = 0x9a;
    if (0x1f < *size) {
      pBVar1 = *buffer;
      uVar2 = *(undefined8 *)pBVar1;
      uVar3 = *(undefined8 *)(pBVar1 + 8);
      uVar4 = *(undefined8 *)(pBVar1 + 0x18);
      *(undefined8 *)(target->sha1 + 0x10) = *(undefined8 *)(pBVar1 + 0x10);
      *(undefined8 *)(target->sha1 + 0x18) = uVar4;
      *(undefined8 *)target = uVar2;
      *(undefined8 *)(target->sha1 + 8) = uVar3;
      *size = *size + -0x20;
      *buffer = *buffer + 0x20;
      return 0;
    }
    break;
  case 0xc:
    TVar9 = 0x9a;
    if (0x2f < *size) {
      pBVar1 = *buffer;
      uVar2 = *(undefined8 *)pBVar1;
      uVar3 = *(undefined8 *)(pBVar1 + 8);
      uVar4 = *(undefined8 *)(pBVar1 + 0x10);
      uVar5 = *(undefined8 *)(pBVar1 + 0x18);
      uVar6 = *(undefined8 *)(pBVar1 + 0x28);
      *(undefined8 *)(target->sha1 + 0x20) = *(undefined8 *)(pBVar1 + 0x20);
      *(undefined8 *)(target->sha1 + 0x28) = uVar6;
      *(undefined8 *)(target->sha1 + 0x10) = uVar4;
      *(undefined8 *)(target->sha1 + 0x18) = uVar5;
      *(undefined8 *)target = uVar2;
      *(undefined8 *)(target->sha1 + 8) = uVar3;
      *size = *size + -0x30;
      *buffer = *buffer + 0x30;
      return 0;
    }
    break;
  case 0xd:
    TVar9 = 0x9a;
    if (0x3f < *size) {
      pBVar1 = *buffer;
      uVar2 = *(undefined8 *)pBVar1;
      uVar3 = *(undefined8 *)(pBVar1 + 8);
      uVar4 = *(undefined8 *)(pBVar1 + 0x10);
      uVar5 = *(undefined8 *)(pBVar1 + 0x18);
      uVar6 = *(undefined8 *)(pBVar1 + 0x20);
      uVar7 = *(undefined8 *)(pBVar1 + 0x28);
      uVar8 = *(undefined8 *)(pBVar1 + 0x38);
      *(undefined8 *)(target->sha1 + 0x30) = *(undefined8 *)(pBVar1 + 0x30);
      *(undefined8 *)(target->sha1 + 0x38) = uVar8;
      *(undefined8 *)(target->sha1 + 0x20) = uVar6;
      *(undefined8 *)(target->sha1 + 0x28) = uVar7;
      *(undefined8 *)(target->sha1 + 0x10) = uVar4;
      *(undefined8 *)(target->sha1 + 0x18) = uVar5;
      *(undefined8 *)target = uVar2;
      *(undefined8 *)(target->sha1 + 8) = uVar3;
      *size = *size + -0x40;
      *buffer = *buffer + 0x40;
      return 0;
    }
    break;
  case 0xe:
  case 0xf:
    return 0x98;
  case 0x10:
    break;
  default:
    if (selector != 4) {
      return 0x98;
    }
    TVar9 = 0x9a;
    if (0x13 < *size) {
      pBVar1 = *buffer;
      *(undefined4 *)(target->sha1 + 0x10) = *(undefined4 *)(pBVar1 + 0x10);
      uVar2 = *(undefined8 *)(pBVar1 + 8);
      *(undefined8 *)target = *(undefined8 *)pBVar1;
      *(undefined8 *)(target->sha1 + 8) = uVar2;
      *size = *size + -0x14;
      *buffer = *buffer + 0x14;
      return 0;
    }
  }
  return TVar9;
}

Assistant:

TPM_RC
TPMU_HA_Unmarshal(TPMU_HA *target, BYTE **buffer, INT32 *size, UINT32 selector)
{
    switch(selector) {
#if         ALG_SHA1
        case TPM_ALG_SHA1:
            return BYTE_Array_Unmarshal((BYTE *)(target->sha1), buffer, size, (INT32)SHA1_DIGEST_SIZE);
#endif // ALG_SHA1
#if         ALG_SHA256
        case TPM_ALG_SHA256:
            return BYTE_Array_Unmarshal((BYTE *)(target->sha256), buffer, size, (INT32)SHA256_DIGEST_SIZE);
#endif // ALG_SHA256
#if         ALG_SHA384
        case TPM_ALG_SHA384:
            return BYTE_Array_Unmarshal((BYTE *)(target->sha384), buffer, size, (INT32)SHA384_DIGEST_SIZE);
#endif // ALG_SHA384
#if         ALG_SHA512
        case TPM_ALG_SHA512:
            return BYTE_Array_Unmarshal((BYTE *)(target->sha512), buffer, size, (INT32)SHA512_DIGEST_SIZE);
#endif // ALG_SHA512
#if         ALG_SM3_256
        case TPM_ALG_SM3_256:
            return BYTE_Array_Unmarshal((BYTE *)(target->sm3_256), buffer, size, (INT32)SM3_256_DIGEST_SIZE);
#endif // ALG_SM3_256
        case TPM_ALG_NULL:
            return TPM_RC_SUCCESS;
    }
    return TPM_RC_SELECTOR;
}